

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,Branch *b)

{
  bool bVar1;
  CodePrinter *this_00;
  Block *this_01;
  Block *b_00;
  ArrayView<soul::pool_ref<soul::heart::Expression>_> local_58 [2];
  string local_38;
  Branch *local_18;
  Branch *b_local;
  PrinterStream *this_local;
  
  local_18 = b;
  b_local = (Branch *)this;
  this_00 = choc::text::CodePrinter::operator<<(this->out,"branch ");
  this_01 = pool_ref::operator_cast_to_Block_((pool_ref *)&local_18->target);
  getBlockName_abi_cxx11_(&local_38,(PrinterStream *)this_01,b_00);
  choc::text::CodePrinter::operator<<(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::empty
                    (&local_18->targetArgs);
  if (!bVar1) {
    ArrayView<soul::pool_ref<soul::heart::Expression>>::
    ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayView<soul::pool_ref<soul::heart::Expression>> *)local_58,&local_18->targetArgs)
    ;
    printArgList(this,local_58);
  }
  return;
}

Assistant:

void printDescription (const heart::Branch& b)
        {
            out << "branch " << getBlockName (b.target);

            if (! b.targetArgs.empty())
                printArgList (b.targetArgs);
        }